

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit.h
# Opt level: O2

void assert_dbl_array_near(double *exp,double *real,size_t n,double tol,char *caller,int line)

{
  int line_00;
  size_t i;
  size_t sVar1;
  double in_XMM2_Qa;
  
  line_00 = (int)real;
  for (sVar1 = 0; n != sVar1; sVar1 = sVar1 + 1) {
    assert_dbl_near(exp[sVar1],real[sVar1],in_XMM2_Qa,(char *)((ulong)caller & 0xffffffff),line_00);
  }
  return;
}

Assistant:

inline static void assert_dbl_array_near(double *exp, double *real, size_t n, double tol, char const *caller, int line)
{
  for (size_t i = 0; i < n; ++i)
  {
    assert_dbl_near(exp[i], real[i], tol, caller, line);
  }
}